

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void INT_EVfree_stone(CManager_conflict cm,EVstone stone_num)

{
  event_path_data evp;
  FILE *pFVar1;
  _proto_action *p_Var2;
  attr_list l;
  void *pvVar3;
  code *pcVar4;
  int iVar5;
  __pid_t _Var6;
  stone_type stone;
  pthread_t pVar7;
  event_item *event;
  long lVar8;
  CManager_conflict evp_00;
  long lVar9;
  timespec ts;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_num);
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Freeing stone %d\n",stone_num);
  }
  fflush((FILE *)cm->CMTrace_file);
  if ((stone != (stone_type)0x0) && (stone->local_id != -1)) {
    if (stone->periodic_handle != (CMTaskHandle)0x0) {
      INT_CMremove_task(stone->periodic_handle);
      stone->periodic_handle = (CMTaskHandle)0x0;
    }
    lVar9 = 0x30;
    for (lVar8 = 0; lVar8 < stone->proto_action_count; lVar8 = lVar8 + 1) {
      p_Var2 = stone->proto_actions;
      l = *(attr_list *)((long)&p_Var2->o + lVar9 + 8);
      if (l != (attr_list)0x0) {
        CMint_free_attr_list
                  (cm,l,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                   ,0x135);
      }
      free(*(void **)((long)p_Var2 + lVar9 + -0x20));
      switch(*(undefined4 *)((long)p_Var2 + lVar9 + -0x30)) {
      case 1:
        if (*(long *)((long)p_Var2 + lVar9 + -0x18) != 0) {
          iVar5 = CMtrace_val[7];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar5 = CMtrace_init(cm,CMFreeVerbose);
          }
          if (iVar5 != 0) {
            if (CMtrace_PID != 0) {
              pFVar1 = (FILE *)cm->CMTrace_file;
              _Var6 = getpid();
              pVar7 = pthread_self();
              fprintf(pFVar1,"P%lxT%lx - ",(long)_Var6,pVar7);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,"Closing and dereferencing conn %p in free stone\n",
                    *(undefined8 *)((long)p_Var2 + lVar9 + -0x18));
          }
          fflush((FILE *)cm->CMTrace_file);
          INT_CMConnection_dereference(*(CMConnection *)((long)p_Var2 + lVar9 + -0x18));
        }
        if (*(long *)((long)&p_Var2->matching_reference_formats + lVar9) != 0) {
          free_attr_list();
          *(undefined8 *)((long)&p_Var2->matching_reference_formats + lVar9) = 0;
        }
        pvVar3 = *(void **)((long)p_Var2 + lVar9 + -8);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
LAB_0012cb70:
          *(undefined8 *)((long)p_Var2 + lVar9 + -8) = 0;
        }
        break;
      case 5:
      case 6:
      case 0xb:
        pvVar3 = *(void **)((long)p_Var2 + lVar9 + -0x18);
        if (pvVar3 != (void *)0x0) {
          response_data_free(cm,pvVar3);
        }
        break;
      case 7:
        if (*(long *)((long)p_Var2 + lVar9 + -8) != 0) {
          free_FFSContext();
          goto LAB_0012cb70;
        }
        break;
      case 10:
        pcVar4 = *(code **)(*(long *)((long)&p_Var2->matching_reference_formats + lVar9) + 8);
        if (pcVar4 != (code *)0x0) {
          (*pcVar4)(cm,(long)&p_Var2->action_type + lVar9);
        }
      }
      lVar9 = lVar9 + 0x60;
    }
    while (stone->queue->queue_head != (queue_item *)0x0) {
      evp_00 = cm;
      event = dequeue_event(cm,stone);
      return_event((event_path_data)evp_00,event);
    }
    free(stone->proto_actions);
    if (stone->response_cache != (response_cache_element *)0x0) {
      free_response_cache(stone);
    }
    free(stone->queue);
    stone->queue = (queue_ptr)0x0;
    stone->proto_action_count = 0;
    stone->proto_actions = (_proto_action *)0x0;
    if (stone->stone_attrs != (attr_list)0x0) {
      CMint_free_attr_list
                (cm,stone->stone_attrs,
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                 ,0x173);
      stone->stone_attrs = (attr_list)0x0;
    }
    free(stone->output_stone_ids);
    remove_stone_from_lookup(evp,stone_num);
    evp->stone_map[(long)stone->local_id - (long)evp->stone_base_num] = (stone_type)0x0;
    free(stone);
  }
  return;
}

Assistant:

void
INT_EVfree_stone(CManager cm, EVstone stone_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int i;

    stone = stone_struct(evp, stone_num);
    CMtrace_out(cm, CMFreeVerbose, "Freeing stone %d\n", stone_num);
    if (stone == NULL) return;
    if (stone->local_id == -1) return;
    if (stone->periodic_handle != NULL) {
	INT_CMremove_task(stone->periodic_handle);
	stone->periodic_handle = NULL;
    }
    for(i = 0; i < stone->proto_action_count; i++) {
	proto_action *act = &stone->proto_actions[i];
	if (act->attrs != NULL) {
	    INT_CMfree_attr_list(cm, act->attrs);
	}
	if (act->matching_reference_formats != NULL) 
	    free(act->matching_reference_formats);
	switch(act->action_type) {
	case Action_NoAction:
	case Action_Source:
	case Action_Encode_to_Buffer:
	case Action_Thread_Bridge:
	    break;
	case Action_Bridge:
	    if (act->o.bri.conn) {
		CMtrace_out(cm, CMFreeVerbose, "Closing and dereferencing conn %p in free stone\n", act->o.bri.conn);
		INT_CMConnection_dereference(act->o.bri.conn);
	    }
            if (act->o.bri.remote_contact) {
                free_attr_list(act->o.bri.remote_contact);
                act->o.bri.remote_contact = NULL;
            }
	    if (act->o.bri.remote_path) {
		free(act->o.bri.remote_path);
                act->o.bri.remote_path = NULL;
            }
	    break;
	case Action_Terminal:
	    break;
	case Action_Filter:
	    break;
	case Action_Decode:
	    if (act->o.decode.context) {
		free_FFSContext(act->o.decode.context);
		act->o.decode.context = NULL;
	    }
	    break;
	case Action_Split:
	    break;
	case Action_Immediate:
        case Action_Multi:
        case Action_Congestion:
	    if (act->o.imm.mutable_response_data != NULL) {
		response_data_free(cm, act->o.imm.mutable_response_data);
	    }
	    break;
        case Action_Store:
            storage_queue_cleanup(cm, &act->o.store.queue);
            break; 
	}
    }
    while (stone->queue->queue_head != NULL) {
      event_item *event = dequeue_event(cm, stone);
      return_event(evp, event);
    }
    if (stone->proto_actions != NULL) free(stone->proto_actions);
    if (stone->response_cache != NULL) free_response_cache(stone);
    
    free(stone->queue);
      
    /* XXX unsquelch senders */
    stone->queue = NULL;
    stone->proto_action_count = 0;
    stone->proto_actions = NULL;
    if (stone->stone_attrs != NULL) {
	INT_CMfree_attr_list(cm, stone->stone_attrs);
	stone->stone_attrs = NULL;
    }
    free(stone->output_stone_ids);
    remove_stone_from_lookup(evp, stone_num);
    evp->stone_map[stone->local_id - evp->stone_base_num] = NULL;
    stone->local_id = -1;
    free(stone);
}